

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::cancelUntilTrailRecord(Solver *this)

{
  int iVar1;
  long lVar2;
  
  for (lVar2 = (long)(this->trail).sz; iVar1 = this->trailRecord, iVar1 < lVar2; lVar2 = lVar2 + -1)
  {
    (this->assigns).data[(this->trail).data[lVar2 + -1].x >> 1].value = '\x02';
  }
  this->qhead = iVar1;
  vec<Minisat::Lit>::shrink(&this->trail,(this->trail).sz - iVar1);
  return;
}

Assistant:

void Solver::cancelUntilTrailRecord()
{
    for (int c = trail.size() - 1; c >= trailRecord; c--) {
        Var x = var(trail[c]);
        assigns[x] = l_Undef;
    }
    qhead = trailRecord;
    trail.shrink(trail.size() - trailRecord);
}